

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O3

void __thiscall irr::core::string<char>::string(string<char> *this,double number)

{
  char *pcVar1;
  c8 tmpbuf [32];
  char acStack_38 [32];
  
  (this->str)._M_dataplus._M_p = (pointer)&(this->str).field_2;
  (this->str)._M_string_length = 0;
  (this->str).field_2._M_local_buf[0] = '\0';
  snprintf(acStack_38,0x20,"%0.6f");
  pcVar1 = (char *)(this->str)._M_string_length;
  strlen(acStack_38);
  ::std::__cxx11::string::_M_replace((ulong)this,0,pcVar1,(ulong)acStack_38);
  return;
}

Assistant:

explicit string(const double number)
	{
		c8 tmpbuf[32];
		snprintf_irr(tmpbuf, sizeof(tmpbuf), "%0.6f", number);
		str = tmpbuf;
	}